

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmessagebox.cpp
# Opt level: O2

void QMessageBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QPixmap *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  QFlagsStorage<QMessageBox::StandardButton> QVar5;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  qsizetype local_38;
  QWidgetData *local_28;
  
  local_28 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  if (_id == 0 && _c == InvokeMetaMethod) {
    buttonClicked((QMessageBox *)_o,*_a[1]);
  }
  if (_c != ReadProperty) {
    if (_c == WriteProperty) {
      if ((uint)_id < 9) {
        pQVar1 = (QPixmap *)*_a;
        switch(_id) {
        case 0:
          if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28) {
            setText((QMessageBox *)_o,(QString *)pQVar1);
            return;
          }
          break;
        case 1:
          if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28) {
            setIcon((QMessageBox *)_o,*(Icon *)pQVar1);
            return;
          }
          break;
        case 2:
          if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28) {
            setIconPixmap((QMessageBox *)_o,pQVar1);
            return;
          }
          break;
        case 3:
          if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28) {
            setTextFormat((QMessageBox *)_o,*(TextFormat *)pQVar1);
            return;
          }
          break;
        case 4:
          if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28) {
            setStandardButtons((QMessageBox *)_o,
                               (QFlagsStorageHelper<QMessageBox::StandardButton,_4>)
                               *(QFlagsStorageHelper<QMessageBox::StandardButton,_4> *)pQVar1);
            return;
          }
          break;
        case 5:
          if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28) {
            setDetailedText((QMessageBox *)_o,(QString *)pQVar1);
            return;
          }
          break;
        case 6:
          if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28) {
            setInformativeText((QMessageBox *)_o,(QString *)pQVar1);
            return;
          }
          break;
        case 7:
          if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28) {
            setTextInteractionFlags
                      ((QMessageBox *)_o,
                       (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
                       *(QFlagsStorageHelper<Qt::TextInteractionFlag,_4> *)pQVar1);
            return;
          }
          break;
        case 8:
          if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28) {
            setOptions((QMessageBox *)_o,
                       (QFlagsStorageHelper<QMessageBox::Option,_4>)
                       *(QFlagsStorageHelper<QMessageBox::Option,_4> *)pQVar1);
            return;
          }
        }
        goto LAB_004bc6ee;
      }
    }
    else if (_c == IndexOfMethod) {
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28) {
        QtMocHelpers::indexOfMethod<void(QMessageBox::*)(QAbstractButton*)>
                  ((QtMocHelpers *)_a,(void **)buttonClicked,0,0);
        return;
      }
      goto LAB_004bc6ee;
    }
    goto LAB_004bc6d3;
  }
  if (8 < (uint)_id) goto LAB_004bc6d3;
  pQVar1 = (QPixmap *)*_a;
  switch(_id) {
  case 0:
    text((QString *)local_48,(QMessageBox *)_o);
    goto LAB_004bc698;
  case 1:
    QVar5.i = *(Int *)(*(long *)(_o + 8) + 0x2e8);
    break;
  case 2:
    iconPixmap((QMessageBox *)local_48);
    QPixmap::operator=(pQVar1,(QPixmap *)local_48);
    QPixmap::~QPixmap((QPixmap *)local_48);
    goto LAB_004bc6d3;
  case 3:
    QVar5.i = textFormat((QMessageBox *)_o);
    break;
  case 4:
    QVar5.i = (Int)standardButtons((QMessageBox *)_o);
    break;
  case 5:
    detailedText((QString *)local_48,(QMessageBox *)_o);
    goto LAB_004bc698;
  case 6:
    informativeText((QString *)local_48,(QMessageBox *)_o);
LAB_004bc698:
    pDVar3 = *(Data **)pQVar1;
    pcVar4 = *(char16_t **)(pQVar1 + 8);
    *(undefined8 *)pQVar1 = local_48._0_8_;
    *(undefined8 *)(pQVar1 + 8) = local_48._8_8_;
    qVar2 = *(qsizetype *)(pQVar1 + 0x10);
    *(qsizetype *)(pQVar1 + 0x10) = local_38;
    local_48._0_8_ = pDVar3;
    local_48._8_8_ = pcVar4;
    local_38 = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_48);
    goto LAB_004bc6d3;
  case 7:
    QVar5.i = (Int)textInteractionFlags((QMessageBox *)_o);
    break;
  case 8:
    QVar5.i = (Int)options((QMessageBox *)_o);
  }
  *(Int *)pQVar1 = QVar5.i;
LAB_004bc6d3:
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_004bc6ee:
  __stack_chk_fail();
}

Assistant:

void QMessageBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMessageBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->buttonClicked((*reinterpret_cast< std::add_pointer_t<QAbstractButton*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMessageBox::*)(QAbstractButton * )>(_a, &QMessageBox::buttonClicked, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast<Icon*>(_v) = _t->icon(); break;
        case 2: *reinterpret_cast<QPixmap*>(_v) = _t->iconPixmap(); break;
        case 3: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->textFormat(); break;
        case 4: QtMocHelpers::assignFlags<StandardButtons>(_v, _t->standardButtons()); break;
        case 5: *reinterpret_cast<QString*>(_v) = _t->detailedText(); break;
        case 6: *reinterpret_cast<QString*>(_v) = _t->informativeText(); break;
        case 7: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 8: *reinterpret_cast<Options*>(_v) = _t->options(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setIcon(*reinterpret_cast<Icon*>(_v)); break;
        case 2: _t->setIconPixmap(*reinterpret_cast<QPixmap*>(_v)); break;
        case 3: _t->setTextFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 4: _t->setStandardButtons(*reinterpret_cast<StandardButtons*>(_v)); break;
        case 5: _t->setDetailedText(*reinterpret_cast<QString*>(_v)); break;
        case 6: _t->setInformativeText(*reinterpret_cast<QString*>(_v)); break;
        case 7: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        case 8: _t->setOptions(*reinterpret_cast<Options*>(_v)); break;
        default: break;
        }
    }
}